

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianEdgeCalculator.cpp
# Opt level: O3

void __thiscall
GaussianEdgeCalculator::GaussianEdgeCalculator
          (GaussianEdgeCalculator *this,double significance_level,double insert_size_mean,
          double insert_size_stddev)

{
  type tVar1;
  double *pdVar2;
  char *pmessage;
  size_t x;
  long lVar3;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar4;
  double local_70;
  normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  *local_68;
  double *local_60;
  normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  *local_58;
  undefined1 local_48 [16];
  normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  local_38;
  
  (this->super_EdgeCalculator)._vptr_EdgeCalculator =
       (_func_int **)&PTR__GaussianEdgeCalculator_001b7f08;
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = significance_level;
  local_48._12_4_ = in_XMM0_Dd;
  this->significance_level = significance_level;
  this->insert_size_popmean = insert_size_mean;
  this->insert_size_popstddev = insert_size_stddev;
  local_58 = (normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
              *)insert_size_stddev;
  pdVar2 = (double *)operator_new__(0x4b320);
  this->cached_survival_function = pdVar2;
  local_38.m_mean._0_4_ = 0;
  local_38.m_mean._4_4_ = 0;
  local_38.m_sd._0_4_ = 0;
  local_38.m_sd._4_4_ = 0x3ff00000;
  lVar3 = 0;
  do {
    local_70 = (double)lVar3 * 0.001;
    local_68 = &local_38;
    local_60 = &local_70;
    dVar4 = boost::math::
            cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((complemented2_type<boost::math::normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_double>
                        *)&local_68);
    this->cached_survival_function[lVar3] = dVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x9664);
  local_68 = (normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
              *)((double)local_58 * 1.4142135623730951);
  if ((undefined1 *)((long)&local_68[-1].m_sd + 7U) < (undefined1 *)0xfffffffffffff ||
      -1 < (long)local_68 &&
      (uint)((ulong)((long)ABS((double)local_68) + -0x10000000000000) >> 0x35) < 0x3ff) {
    local_70 = (double)local_48._0_8_ * 0.5;
    if ((0.0 <= local_70 && local_70 <= 1.0) && (long)ABS(local_70) < 0x7ff0000000000000) {
      local_58 = local_68;
      tVar1 = boost::math::
              erfc_inv<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        (local_70 + local_70,
                         (policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                          *)&local_68);
      dVar4 = (double)local_58 * -1.4142135623730951 * tVar1 + 0.0;
      goto LAB_0015f17b;
    }
    pmessage = "Probability argument is %1%, but must be >= 0 and <= 1 !";
    pdVar2 = &local_70;
  }
  else {
    local_58 = local_68;
    boost::math::policies::detail::raise_error<std::domain_error,double>
              (boost::math::
               normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
               ::normal_distribution::function,"Scale parameter is %1%, but must be > 0 !",
               (double *)&local_68);
    local_68 = local_58;
    pdVar2 = (double *)&local_68;
    pmessage = "Scale parameter is %1%, but must be > 0 !";
  }
  boost::math::policies::detail::raise_error<std::domain_error,double>
            (boost::math::
             quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>(boost::math::normal_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>const&,double_const&)
             ::function,pmessage,pdVar2);
  dVar4 = NAN;
LAB_0015f17b:
  dVar4 = floor(-dVar4);
  this->allowable_insert_size_diff = (int)dVar4;
  return;
}

Assistant:

GaussianEdgeCalculator::GaussianEdgeCalculator(double significance_level, double insert_size_mean, double insert_size_stddev) {
	this->significance_level = significance_level;
	this->insert_size_popmean = insert_size_mean;
	this->insert_size_popstddev = insert_size_stddev;
	cached_survival_function = new double[SF_CACHE_SIZE];
	boost::math::normal norm;
	for (size_t x=0; x<SF_CACHE_SIZE; ++x) {
		cached_survival_function[x] = boost::math::cdf(boost::math::complement(norm,x*SF_CACHE_FACTOR));
	}
	boost::math::normal norm2(0,sqrt2*insert_size_stddev);
	this->allowable_insert_size_diff = (int)floor(-boost::math::quantile(norm2, significance_level/2.0));
	// cout << "allowable insert size difference: " << allowable_insert_size_diff << endl;
}